

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int closePendingFds(unixFile *pFile)

{
  unixInodeInfo *puVar1;
  UnixUnusedFd *pUVar2;
  int iVar3;
  int *piVar4;
  UnixUnusedFd *pNext;
  UnixUnusedFd *p;
  UnixUnusedFd *pError;
  unixInodeInfo *pInode;
  int rc;
  unixFile *pFile_local;
  
  pInode._4_4_ = 0;
  puVar1 = pFile->pInode;
  p = (UnixUnusedFd *)0x0;
  pNext = puVar1->pUnused;
  while (pNext != (UnixUnusedFd *)0x0) {
    pUVar2 = pNext->pNext;
    iVar3 = close(pNext->fd);
    if (iVar3 == 0) {
      unqlite_free(pNext);
      pNext = pUVar2;
    }
    else {
      piVar4 = __errno_location();
      pFile->lastErrno = *piVar4;
      pInode._4_4_ = -2;
      pNext->pNext = p;
      p = pNext;
      pNext = pUVar2;
    }
  }
  puVar1->pUnused = p;
  return pInode._4_4_;
}

Assistant:

static int closePendingFds(unixFile *pFile){
  int rc = UNQLITE_OK;
  unixInodeInfo *pInode = pFile->pInode;
  UnixUnusedFd *pError = 0;
  UnixUnusedFd *p;
  UnixUnusedFd *pNext;
  for(p=pInode->pUnused; p; p=pNext){
    pNext = p->pNext;
    if( close(p->fd) ){
      pFile->lastErrno = errno;
	  rc = UNQLITE_IOERR;
      p->pNext = pError;
      pError = p;
    }else{
      unqlite_free(p);
    }
  }
  pInode->pUnused = pError;
  return rc;
}